

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

void duckdb_je_tsd_postfork_child(tsd_t *tsd)

{
  malloc_mutex_t *in_RDI;
  tsdn_t *in_stack_fffffffffffffff0;
  
  duckdb_je_malloc_mutex_postfork_child(in_stack_fffffffffffffff0,in_RDI);
  tsd_nominal_tsds.qlh_first = (tsd_t *)0x0;
  if (*(byte *)((long)&in_RDI[7].field_0 + 0x28) < 3) {
    tsd_add_nominal((tsd_t *)0x2591f60);
  }
  return;
}

Assistant:

void
tsd_postfork_child(tsd_t *tsd) {
	malloc_mutex_postfork_child(tsd_tsdn(tsd), &tsd_nominal_tsds_lock);
	ql_new(&tsd_nominal_tsds);

	if (tsd_state_get(tsd) <= tsd_state_nominal_max) {
		tsd_add_nominal(tsd);
	}
}